

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fClippingTests.cpp
# Opt level: O1

string * __thiscall
deqp::gles2::Functional::(anonymous_namespace)::genColorString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Vec4 *p)

{
  float *pfVar1;
  ulong uVar2;
  ulong uVar3;
  char *pcVar4;
  char *pcVar5;
  Vec4 blue;
  Vec4 yellow;
  Vec4 red;
  Vec4 white;
  undefined8 local_48;
  undefined1 *puStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined1 *puStack_10;
  
  local_18 = &DAT_3f8000003f800000;
  puStack_10 = &DAT_3f8000003f800000;
  local_28 = 0x3f800000;
  uStack_20 = 0x3f80000000000000;
  local_38 = &DAT_3f8000003f800000;
  uStack_30 = 0x3f80000000000000;
  local_48 = 0;
  puStack_40 = &DAT_3f8000003f800000;
  if ((*(float *)this == 1.0) && (!NAN(*(float *)this))) {
    uVar2 = 0;
    while (uVar3 = uVar2, uVar3 != 3) {
      pfVar1 = (float *)((long)&local_18 + uVar3 * 4 + 4);
      if ((*(float *)(this + uVar3 * 4 + 4) != *pfVar1) ||
         (uVar2 = uVar3 + 1, NAN(*(float *)(this + uVar3 * 4 + 4)) || NAN(*pfVar1))) break;
    }
    if (2 < uVar3) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar5 = "(white)";
      pcVar4 = "";
      goto LAB_00fca981;
    }
  }
  if ((*(float *)this == 1.0) && (!NAN(*(float *)this))) {
    uVar2 = 0;
    while (uVar3 = uVar2, uVar3 != 3) {
      pfVar1 = (float *)((long)&local_28 + uVar3 * 4 + 4);
      if ((*(float *)(this + uVar3 * 4 + 4) != *pfVar1) ||
         (uVar2 = uVar3 + 1, NAN(*(float *)(this + uVar3 * 4 + 4)) || NAN(*pfVar1))) break;
    }
    if (2 < uVar3) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar5 = "(red)";
      pcVar4 = "";
      goto LAB_00fca981;
    }
  }
  if ((*(float *)this == 1.0) && (!NAN(*(float *)this))) {
    uVar2 = 0;
    while (uVar3 = uVar2, uVar3 != 3) {
      pfVar1 = (float *)((long)&local_38 + uVar3 * 4 + 4);
      if ((*(float *)(this + uVar3 * 4 + 4) != *pfVar1) ||
         (uVar2 = uVar3 + 1, NAN(*(float *)(this + uVar3 * 4 + 4)) || NAN(*pfVar1))) break;
    }
    if (2 < uVar3) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar5 = "(yellow)";
      pcVar4 = "";
      goto LAB_00fca981;
    }
  }
  if ((*(float *)this == 0.0) && (!NAN(*(float *)this))) {
    uVar2 = 0;
    while (uVar3 = uVar2, uVar3 != 3) {
      pfVar1 = (float *)((long)&local_48 + uVar3 * 4 + 4);
      if ((*(float *)(this + uVar3 * 4 + 4) != *pfVar1) ||
         (uVar2 = uVar3 + 1, NAN(*(float *)(this + uVar3 * 4 + 4)) || NAN(*pfVar1))) break;
    }
    if (2 < uVar3) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar5 = "(blue)";
      pcVar4 = "";
      goto LAB_00fca981;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar4 = "";
  pcVar5 = "";
LAB_00fca981:
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar5,pcVar4);
  return __return_storage_ptr__;
}

Assistant:

std::string genColorString(const tcu::Vec4& p)
{
	const tcu::Vec4 white	(1.0f, 1.0f, 1.0f, 1.0f);
	const tcu::Vec4 red		(1.0f, 0.0f, 0.0f, 1.0f);
	const tcu::Vec4 yellow	(1.0f, 1.0f, 0.0f, 1.0f);
	const tcu::Vec4 blue	(0.0f, 0.0f, 1.0f, 1.0f);

	if (p == white)		return "(white)";
	if (p == red)		return "(red)";
	if (p == yellow)	return "(yellow)";
	if (p == blue)		return "(blue)";
	return "";
}